

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O1

void __thiscall
capnp::PipelineBuilder<capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyResults>::
PipelineBuilder(PipelineBuilder<capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyResults>
                *this,uint firstSegmentWords)

{
  PipelineBuilderPair local_78;
  StructBuilder local_50;
  PointerBuilder local_28;
  
  capnp::_::newPipelineBuilder(&local_78,firstSegmentWords);
  local_28.pointer = local_78.root.builder.pointer;
  local_28.segment = local_78.root.builder.segment;
  local_28.capTable = local_78.root.builder.capTable;
  capnp::_::PointerBuilder::initStruct(&local_50,&local_28,(StructSize)0x10000);
  (this->super_Builder)._builder.dataSize = local_50.dataSize;
  (this->super_Builder)._builder.pointerCount = local_50.pointerCount;
  *(undefined2 *)&(this->super_Builder)._builder.field_0x26 = local_50._38_2_;
  (this->super_Builder)._builder.data = local_50.data;
  (this->super_Builder)._builder.pointers = local_50.pointers;
  (this->super_Builder)._builder.segment = local_50.segment;
  (this->super_Builder)._builder.capTable = local_50.capTable;
  (this->hook).disposer = local_78.hook.disposer;
  (this->hook).ptr = local_78.hook.ptr;
  return;
}

Assistant:

PipelineBuilder<T>::PipelineBuilder(uint firstSegmentWords)
    : PipelineBuilder(_::newPipelineBuilder(firstSegmentWords)) {}